

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemFile.cpp
# Opt level: O3

ssize_t __thiscall MemFile::read(MemFile *this,int __fd,void *__buf,size_t __nbytes)

{
  uchar *__src;
  int iVar1;
  int iVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  int iVar4;
  
  uVar3 = __nbytes & 0xffffffff;
  iVar2 = (int)__buf;
  if (iVar2 != 0) {
    __src = (this->m_it)._M_current;
    iVar4 = *(int *)&(this->m_data).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (int)__src;
    if ((int)((long)iVar4 / (long)iVar2) < (int)__nbytes) {
      uVar3 = (long)iVar4 / (long)iVar2 & 0xffffffff;
    }
    iVar2 = iVar2 * (int)uVar3;
    iVar1 = iVar2;
    if (iVar4 < iVar2) {
      iVar1 = iVar4;
    }
    if (iVar1 != 0 && iVar2 <= iVar4) {
      memcpy((void *)CONCAT44(in_register_00000034,__fd),__src,(long)iVar1);
      (this->m_it)._M_current = (this->m_it)._M_current + iVar1;
    }
  }
  return uVar3;
}

Assistant:

int MemFile::read(void* buf, int len, int count)
{
    if (!len) return count; // can read as many zero-length units as requested!

    auto avail_items = std::min(count, remaining() / len);
    read(buf, avail_items * len);
    return avail_items;
}